

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_analysis.cpp
# Opt level: O3

loop_variable * __thiscall
loop_variable_state::get_or_insert(loop_variable_state *this,ir_variable *var,bool in_assignee)

{
  hash_entry *phVar1;
  loop_variable *plVar2;
  
  if (((var != (ir_variable *)0x0) &&
      (phVar1 = _mesa_hash_table_search(this->var_hash,var), phVar1 != (hash_entry *)0x0)) &&
     ((loop_variable *)phVar1->data != (loop_variable *)0x0)) {
    return (loop_variable *)phVar1->data;
  }
  plVar2 = insert(this,var);
  plVar2->read_before_write = !in_assignee;
  return plVar2;
}

Assistant:

loop_variable *
loop_variable_state::get_or_insert(ir_variable *var, bool in_assignee)
{
   loop_variable *lv = this->get(var);

   if (lv == NULL) {
      lv = this->insert(var);
      lv->read_before_write = !in_assignee;
   }

   return lv;
}